

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.hpp
# Opt level: O1

int __thiscall diy::FileStorage::make_file_record(FileStorage *this,string *filename,size_t sz)

{
  critical_resource<unsigned_long,_tthread::fast_mutex> *pcVar1;
  pointer pcVar2;
  int iVar3;
  mapped_type *pmVar4;
  accessor cur;
  int res;
  FileRecord fr;
  accessor max;
  unique_lock<tthread::fast_mutex> local_80;
  int local_6c;
  critical_resource<int,_tthread::fast_mutex> *local_68;
  unique_lock<tthread::fast_mutex> local_60;
  long local_50 [2];
  critical_resource<unsigned_long,_tthread::fast_mutex> *local_40;
  unique_lock<tthread::fast_mutex> local_38;
  
  local_68 = &this->count_;
  local_60._M_device = &(this->count_).m_;
  local_60._M_owns = false;
  std::unique_lock<tthread::fast_mutex>::lock(&local_60);
  local_6c = local_68->x_;
  local_68->x_ = local_6c + 1;
  if (local_60._M_device != (fast_mutex *)0x0) {
    LOCK();
    (local_60._M_device)->mLock = 0;
    UNLOCK();
  }
  local_60._M_owns = local_60._M_device == (fast_mutex *)0x0;
  pcVar2 = (filename->_M_dataplus)._M_p;
  local_68 = (critical_resource<int,_tthread::fast_mutex> *)sz;
  local_60._M_device = (mutex_type *)local_50;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar2,pcVar2 + filename->_M_string_length);
  local_80._M_device = &(this->filenames_).m_;
  local_80._M_owns = false;
  std::unique_lock<tthread::fast_mutex>::lock(&local_80);
  local_80._M_owns = true;
  pmVar4 = std::
           map<int,_diy::FileStorage::FileRecord,_std::less<int>,_std::allocator<std::pair<const_int,_diy::FileStorage::FileRecord>_>_>
           ::operator[](&(this->filenames_).x_,&local_6c);
  pmVar4->size = (size_t)local_68;
  std::__cxx11::string::_M_assign((string *)&pmVar4->name);
  if ((local_80._M_owns == true) && (local_80._M_device != (fast_mutex *)0x0)) {
    LOCK();
    (local_80._M_device)->mLock = 0;
    UNLOCK();
  }
  pcVar1 = &this->current_size_;
  local_80._M_device = &(this->current_size_).m_;
  local_80._M_owns = false;
  std::unique_lock<tthread::fast_mutex>::lock(&local_80);
  local_80._M_owns = true;
  pcVar1->x_ = pcVar1->x_ + sz;
  local_40 = &this->max_size_;
  local_38._M_device = &(this->max_size_).m_;
  local_38._M_owns = false;
  std::unique_lock<tthread::fast_mutex>::lock(&local_38);
  iVar3 = local_6c;
  if (local_40->x_ < pcVar1->x_) {
    local_40->x_ = pcVar1->x_;
  }
  if (local_38._M_device != (fast_mutex *)0x0) {
    LOCK();
    (local_38._M_device)->mLock = 0;
    UNLOCK();
  }
  local_38._M_owns = local_38._M_device == (fast_mutex *)0x0;
  if ((local_80._M_owns == true) && (local_80._M_device != (fast_mutex *)0x0)) {
    LOCK();
    (local_80._M_device)->mLock = 0;
    UNLOCK();
    local_80._M_owns = false;
  }
  if (local_60._M_device != (mutex_type *)local_50) {
    operator_delete(local_60._M_device,local_50[0] + 1);
  }
  return iVar3;
}

Assistant:

int           make_file_record(const std::string& filename, size_t sz)
      {
        int res = (*count_.access())++;
        FileRecord  fr = { sz, filename };
        (*filenames_.access())[res] = fr;

        // keep track of sizes
        critical_resource<size_t>::accessor     cur = current_size_.access();
        *cur += sz;
        critical_resource<size_t>::accessor     max = max_size_.access();
        if (*cur > *max)
            *max = *cur;

        return res;
      }